

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

bool __thiscall ASDCP::MXF::RIP::GetPairBySID(RIP *this,ui32_t SID,PartitionPair *outPair)

{
  ui64_t uVar1;
  _List_node_base *p_Var2;
  list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_> *plVar3;
  
  plVar3 = &(this->PairArray).
            super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
  ;
  p_Var2 = (_List_node_base *)plVar3;
  do {
    p_Var2 = (((_List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)plVar3) goto LAB_001958ae;
  } while (*(ui32_t *)&p_Var2[1]._M_prev != SID);
  uVar1 = (ui64_t)p_Var2[2]._M_next;
  *(_List_node_base **)&outPair->BodySID = p_Var2[1]._M_prev;
  outPair->ByteOffset = uVar1;
LAB_001958ae:
  return p_Var2 != (_List_node_base *)plVar3;
}

Assistant:

bool
ASDCP::MXF::RIP::GetPairBySID(ui32_t SID, PartitionPair& outPair) const
{
  RIP::const_pair_iterator i;
  for ( i = PairArray.begin(); i != PairArray.end(); ++i )
    {
      if ( i->BodySID == SID )
	{
	  outPair = *i;
	  return true;
	}
    }

  return false;
}